

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# outqueue.c
# Opt level: O1

lzma_ret lzma_outq_read(lzma_outq *outq,uint8_t *out,size_t *out_pos,size_t out_size,
                       lzma_vli *unpadded_size,lzma_vli *uncompressed_size)

{
  lzma_outbuf *plVar1;
  uint uVar2;
  lzma_vli lVar3;
  uint uVar4;
  lzma_ret lVar5;
  
  uVar2 = outq->bufs_used;
  lVar5 = LZMA_OK;
  if (uVar2 != 0) {
    uVar4 = outq->bufs_pos - uVar2;
    if (outq->bufs_pos < uVar2) {
      uVar4 = uVar4 + outq->bufs_allocated;
    }
    lVar5 = LZMA_OK;
    if (outq->bufs[uVar4].finished == true) {
      plVar1 = outq->bufs + uVar4;
      lzma_bufcpy(plVar1->buf,&outq->read_pos,plVar1->size,out,out_pos,out_size);
      if (plVar1->size <= outq->read_pos) {
        *unpadded_size = plVar1->unpadded_size;
        lVar3 = plVar1->uncompressed_size;
        outq->bufs_used = outq->bufs_used - 1;
        *uncompressed_size = lVar3;
        outq->read_pos = 0;
        lVar5 = LZMA_STREAM_END;
      }
    }
  }
  return lVar5;
}

Assistant:

extern lzma_ret
lzma_outq_read(lzma_outq *restrict outq, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size,
		lzma_vli *restrict unpadded_size,
		lzma_vli *restrict uncompressed_size)
{
	// There must be at least one buffer from which to read.
	if (outq->bufs_used == 0)
		return LZMA_OK;

	// Get the buffer.
	uint32_t i = outq->bufs_pos - outq->bufs_used;
	if (outq->bufs_pos < outq->bufs_used)
		i += outq->bufs_allocated;

	lzma_outbuf *buf = &outq->bufs[i];

	// If it isn't finished yet, we cannot read from it.
	if (!buf->finished)
		return LZMA_OK;

	// Copy from the buffer to output.
	lzma_bufcpy(buf->buf, &outq->read_pos, buf->size,
			out, out_pos, out_size);

	// Return if we didn't get all the data from the buffer.
	if (outq->read_pos < buf->size)
		return LZMA_OK;

	// The buffer was finished. Tell the caller its size information.
	*unpadded_size = buf->unpadded_size;
	*uncompressed_size = buf->uncompressed_size;

	// Free this buffer for further use.
	--outq->bufs_used;
	outq->read_pos = 0;

	return LZMA_STREAM_END;
}